

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall
cmFileListGeneratorFixed::cmFileListGeneratorFixed
          (cmFileListGeneratorFixed *this,cmFileListGeneratorFixed *r)

{
  (this->super_cmFileListGeneratorBase).Next._M_t.
  super___uniq_ptr_impl<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>._M_t
  .super__Tuple_impl<0UL,_cmFileListGeneratorBase_*,_std::default_delete<cmFileListGeneratorBase>_>.
  super__Head_base<0UL,_cmFileListGeneratorBase_*,_false>._M_head_impl =
       (cmFileListGeneratorBase *)0x0;
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorFixed_005e4b88;
  std::__cxx11::string::string((string *)&this->String,(string *)&r->String);
  return;
}

Assistant:

cmFileListGeneratorFixed(cmFileListGeneratorFixed const& r)
    : String(r.String)
  {
  }